

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  Rep *pRVar1;
  Arena *pAVar2;
  undefined8 uVar3;
  LogMessage *pLVar4;
  RepeatedPtrFieldBase temp;
  LogFinisher local_b1;
  RepeatedPtrFieldBase local_b0;
  LogMessage local_98;
  LogMessage local_60;
  
  if (other->arena_ == this->arena_) {
    LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x342);
    pLVar4 = LogMessage::operator<<(&local_60,"CHECK failed: other->GetArena() != GetArena(): ");
    LogFinisher::operator=((LogFinisher *)&local_98,pLVar4);
    LogMessage::~LogMessage(&local_60);
  }
  local_b0.arena_ = other->arena_;
  local_b0.current_size_ = 0;
  local_b0.total_size_ = 0;
  local_b0.rep_ = (Rep *)0x0;
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_b0,this);
  Clear<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this);
  MergeFrom<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(this,other);
  if (&local_b0 == other) {
    LogMessage::LogMessage
              (&local_98,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x6f7);
    pLVar4 = LogMessage::operator<<(&local_98,"CHECK failed: this != rhs: ");
    LogFinisher::operator=(&local_b1,pLVar4);
    LogMessage::~LogMessage(&local_98);
  }
  pRVar1 = other->rep_;
  pAVar2 = other->arena_;
  uVar3._0_4_ = other->current_size_;
  uVar3._4_4_ = other->total_size_;
  other->arena_ = local_b0.arena_;
  other->current_size_ = local_b0.current_size_;
  other->total_size_ = local_b0.total_size_;
  other->rep_ = local_b0.rep_;
  local_b0.arena_ = pAVar2;
  local_b0._8_8_ = uVar3;
  local_b0.rep_ = pRVar1;
  Destroy<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>(&local_b0);
  ~RepeatedPtrFieldBase(&local_b0);
  return;
}

Assistant:

void RepeatedPtrFieldBase::SwapFallback(RepeatedPtrFieldBase* other) {
#ifdef PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(GetArena() == nullptr || other->GetArena() != GetArena());
#else   // PROTOBUF_FORCE_COPY_IN_SWAP
  GOOGLE_DCHECK(other->GetArena() != GetArena());
#endif  // !PROTOBUF_FORCE_COPY_IN_SWAP

  // Copy semantics in this case. We try to improve efficiency by placing the
  // temporary on |other|'s arena so that messages are copied twice rather than
  // three times.
  RepeatedPtrFieldBase temp(other->GetArena());
  temp.MergeFrom<TypeHandler>(*this);
  this->Clear<TypeHandler>();
  this->MergeFrom<TypeHandler>(*other);
  other->InternalSwap(&temp);
  temp.Destroy<TypeHandler>();  // Frees rep_ if `other` had no arena.
}